

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers_test.cpp
# Opt level: O2

void __thiscall Array2D_Bounds_Test::TestBody(Array2D_Bounds_Test *this)

{
  Allocator allocator;
  int iVar1;
  char *pcVar2;
  Bounds2iIterator BVar3;
  undefined8 local_90;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  Array2D<pbrt::Point2<float>_> a;
  Bounds2i b;
  AssertHelper local_38;
  
  b.pMin.super_Tuple2<pbrt::Point2,_int>.x = -4;
  b.pMin.super_Tuple2<pbrt::Point2,_int>.y = 3;
  b.pMax.super_Tuple2<pbrt::Point2,_int>.x = 10;
  b.pMax.super_Tuple2<pbrt::Point2,_int>.y = 7;
  allocator.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Array2D<pbrt::Point2<float>_>::Array2D(&a,&b,allocator);
  gtest_ar_2._0_4_ =
       b.pMax.super_Tuple2<pbrt::Point2,_int>.x - b.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  local_90._0_4_ =
       (float)(a.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
              a.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"b.pMax.x - b.pMin.x","a.xSize()",(int *)&gtest_ar_2,
             (int *)&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/containers_test.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_4_ =
       b.pMax.super_Tuple2<pbrt::Point2,_int>.y - b.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  local_90._0_4_ =
       (float)(a.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
              a.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"b.pMax.y - b.pMin.y","a.ySize()",(int *)&gtest_ar_2,
             (int *)&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/containers_test.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar._0_8_ = b.pMin.super_Tuple2<pbrt::Point2,_int>;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b;
  BVar3 = pbrt::end(&b);
  while (((gtest_ar._0_4_ != BVar3.p.super_Tuple2<pbrt::Point2,_int>.x ||
          (gtest_ar._4_4_ != BVar3.p.super_Tuple2<pbrt::Point2,_int>.y)) ||
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)BVar3.bounds))) {
    iVar1 = (a.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
            a.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) *
            (gtest_ar._4_4_ - a.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
            (gtest_ar._0_4_ - a.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
    a.values[iVar1].super_Tuple2<pbrt::Point2,_float>.x = (float)(int)gtest_ar._4_4_;
    a.values[iVar1].super_Tuple2<pbrt::Point2,_float>.y = (float)(int)gtest_ar._0_4_;
    pbrt::Bounds2iIterator::operator++((Bounds2iIterator *)&gtest_ar);
  }
  gtest_ar._0_8_ = b.pMin.super_Tuple2<pbrt::Point2,_int>;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b;
  BVar3 = pbrt::end(&b);
  while (((gtest_ar._0_4_ != BVar3.p.super_Tuple2<pbrt::Point2,_int>.x ||
          (gtest_ar._4_4_ != BVar3.p.super_Tuple2<pbrt::Point2,_int>.y)) ||
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)BVar3.bounds))) {
    local_90._0_4_ = (float)(int)gtest_ar._4_4_;
    local_90._4_4_ = (float)(int)gtest_ar._0_4_;
    testing::internal::CmpHelperEQ<pbrt::Point2<float>,pbrt::Point2<float>>
              ((internal *)&gtest_ar_2,"Point2f(p.y, p.x)","a[p]",(Point2<float> *)&local_90,
               a.values +
               ((a.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                a.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) *
                (gtest_ar._4_4_ - a.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
               (gtest_ar._0_4_ - a.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x)));
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&local_90);
      pcVar2 = "";
      if (gtest_ar_2.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/containers_test.cpp"
                 ,0x2c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_90);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    pbrt::Bounds2iIterator::operator++((Bounds2iIterator *)&gtest_ar);
  }
  pbrt::Array2D<pbrt::Point2<float>_>::~Array2D(&a);
  return;
}

Assistant:

TEST(Array2D, Bounds) {
    Bounds2i b(Point2i(-4, 3), Point2i(10, 7));
    Array2D<Point2f> a(b);

    EXPECT_EQ(b.pMax.x - b.pMin.x, a.xSize());
    EXPECT_EQ(b.pMax.y - b.pMin.y, a.ySize());

    for (Point2i p : b)
        a[p] = Point2f(p.y, p.x);

    for (Point2i p : b)
        EXPECT_EQ(Point2f(p.y, p.x), a[p]);
}